

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O0

void __thiscall testing::internal::FilePath::Normalize(FilePath *this)

{
  bool bVar1;
  reference pcVar2;
  reference pcVar3;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  char character;
  const_iterator i;
  iterator out;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined2 in_stack_ffffffffffffff84;
  undefined1 in_stack_ffffffffffffff86;
  char in_stack_ffffffffffffff87;
  undefined8 local_60;
  undefined8 local_58;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  undefined8 local_48;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  undefined8 local_38;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  char local_21;
  undefined8 local_20;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18;
  undefined8 local_10;
  
  local_10 = std::__cxx11::string::begin();
  local_18._M_current = (char *)std::__cxx11::string::cbegin();
  while( true ) {
    local_20 = std::__cxx11::string::end();
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)CONCAT17(in_stack_ffffffffffffff87,
                                   CONCAT16(in_stack_ffffffffffffff86,
                                            CONCAT24(in_stack_ffffffffffffff84,
                                                     in_stack_ffffffffffffff80))),
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_ffffffffffffff78._M_current);
    if (!bVar1) break;
    pcVar2 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_18);
    local_21 = *pcVar2;
    bVar1 = IsPathSeparator(local_21);
    if (bVar1) {
      local_38 = std::__cxx11::string::begin();
      bVar1 = __gnu_cxx::operator==
                        ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)CONCAT17(in_stack_ffffffffffffff87,
                                     CONCAT16(in_stack_ffffffffffffff86,
                                              CONCAT24(in_stack_ffffffffffffff84,
                                                       in_stack_ffffffffffffff80))),
                         (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)in_stack_ffffffffffffff78._M_current);
      in_stack_ffffffffffffff86 = true;
      if (!bVar1) {
        local_48 = local_10;
        local_40 = std::prev<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                             (in_stack_ffffffffffffff78,0x13749c);
        pcVar3 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_40);
        in_stack_ffffffffffffff86 = *pcVar3 != '/';
      }
      if ((bool)in_stack_ffffffffffffff86 != false) {
        local_50 = __gnu_cxx::
                   __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator++(in_RDI,CONCAT13(in_stack_ffffffffffffff87,
                                                CONCAT12(in_stack_ffffffffffffff86,
                                                         in_stack_ffffffffffffff84)));
        pcVar3 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_50);
        *pcVar3 = '/';
      }
    }
    else {
      in_stack_ffffffffffffff87 = local_21;
      local_30 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator++(in_RDI,CONCAT13(local_21,CONCAT12(in_stack_ffffffffffffff86,
                                                                in_stack_ffffffffffffff84)));
      pcVar3 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_30);
      *pcVar3 = in_stack_ffffffffffffff87;
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_18);
  }
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)CONCAT17(in_stack_ffffffffffffff87,
                         CONCAT16(in_stack_ffffffffffffff86,
                                  CONCAT24(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80))),
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_ffffffffffffff78._M_current);
  std::__cxx11::string::end();
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)CONCAT17(in_stack_ffffffffffffff87,
                         CONCAT16(in_stack_ffffffffffffff86,
                                  CONCAT24(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80))),
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_ffffffffffffff78._M_current);
  std::__cxx11::string::erase(in_RDI,local_58,local_60);
  return;
}

Assistant:

void FilePath::Normalize() {
  auto out = pathname_.begin();

  auto i = pathname_.cbegin();
#ifdef GTEST_OS_WINDOWS
  // UNC paths are treated specially
  if (pathname_.end() - i >= 3 && IsPathSeparator(*i) &&
      IsPathSeparator(*(i + 1)) && !IsPathSeparator(*(i + 2))) {
    *(out++) = kPathSeparator;
    *(out++) = kPathSeparator;
  }
#endif
  while (i != pathname_.end()) {
    const char character = *i;
    if (!IsPathSeparator(character)) {
      *(out++) = character;
    } else if (out == pathname_.begin() || *std::prev(out) != kPathSeparator) {
      *(out++) = kPathSeparator;
    }
    ++i;
  }

  pathname_.erase(out, pathname_.end());
}